

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

MetadataResult SetPrompt(ShellState *param_1,char **azArg,idx_t nArg)

{
  if (1 < nArg) {
    strncpy(mainPrompt,azArg[1],0x13);
  }
  if (2 < nArg) {
    strncpy(continuePrompt,azArg[2],0x13);
  }
  if (3 < nArg) {
    strncpy(continuePromptSelected,azArg[3],0x13);
  }
  return SUCCESS;
}

Assistant:

MetadataResult SetPrompt(ShellState &, const char **azArg, idx_t nArg) {
	if (nArg >= 2) {
		strncpy(mainPrompt, azArg[1], (int)ArraySize(mainPrompt) - 1);
	}
	if (nArg >= 3) {
		strncpy(continuePrompt, azArg[2], (int)ArraySize(continuePrompt) - 1);
	}
	if (nArg >= 4) {
		strncpy(continuePromptSelected, azArg[3], (int)ArraySize(continuePromptSelected) - 1);
	}
	return MetadataResult::SUCCESS;
}